

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

uint64_t skiwi::anon_unknown_1::compile_and_run(string *input,environment_map *env,repl_data *rd)

{
  fptr local_38;
  fptr f;
  uint64_t size;
  uint64_t result;
  repl_data *rd_local;
  environment_map *env_local;
  string *input_local;
  
  size = 0x27;
  result = (uint64_t)rd;
  rd_local = (repl_data *)env;
  env_local = (environment_map *)input;
  local_38 = compile((uint64_t *)&f,input,env,rd);
  if (local_38 != (fptr)0x0) {
    size = (*local_38)((anonymous_namespace)::cd + 0x30);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)((anonymous_namespace)::cd + 0x230),
               (_func_unsigned_long_void_ptr_varargs **)&local_38,(unsigned_long *)&f);
  }
  return size;
}

Assistant:

uint64_t compile_and_run(const std::string& input, environment_map& env, repl_data& rd)
    {
    using namespace SKIWI;
    uint64_t result = skiwi_undefined;
    uint64_t size;
    auto f = compile(size, input, env, rd);
    if (f)
      {
#ifdef _SKIWI_FOR_ARM
      registers reg;
#ifdef _WIN32
      reg.rcx = (uint64_t)(&cd.ctxt);
#else
      reg.rdi = (uint64_t)(&cd.ctxt);
#endif

      run_bytecode(f, size, reg, cd.externals_for_vm);
      result = reg.rax;
      cd.compiled_bytecode.emplace_back(f, size);
#else
      result = f(&cd.ctxt);
      cd.compiled_functions.emplace_back(f, size);
#endif
      }
    return result;
    }